

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O0

bool ImGui::SliderBehaviorT<unsigned_long_long,long_long,double>
               (ImRect *bb,ImGuiID id,ImGuiDataType data_type,unsigned_long_long *v,
               unsigned_long_long v_min,unsigned_long_long v_max,char *format,ImGuiSliderFlags flags
               ,ImRect *out_grab_bb)

{
  float fVar1;
  bool bVar2;
  bool bVar3;
  bool bVar4;
  uint uVar5;
  float *pfVar6;
  unsigned_long_long uVar7;
  unsigned_long_long *in_RCX;
  float in_EDX;
  ImGuiID in_ESI;
  ImVec2 *in_RDI;
  ulong in_R8;
  ulong in_R9;
  bool bVar8;
  bool bVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  unsigned_long_long unaff_retaddr;
  float in_stack_00000008;
  ImGuiDataType in_stack_0000000c;
  uint in_stack_00000010;
  ImVec2 *in_stack_00000018;
  float grab_pos_1;
  float grab_t_1;
  unsigned_long_long v_new_1;
  float new_clicked_t;
  unsigned_long_long v_new;
  float old_clicked_t;
  float delta;
  int decimal_precision_1;
  bool tweak_fast;
  bool tweak_slow;
  float input_delta;
  bool clicked_around_grab;
  float grab_pos;
  float grab_t;
  float mouse_abs_pos;
  float clicked_t;
  bool set_new_value;
  bool value_changed;
  int decimal_precision;
  float zero_deadzone_halfsize;
  float logarithmic_zero_epsilon;
  float slider_usable_pos_max;
  float slider_usable_pos_min;
  float slider_usable_sz;
  float grab_sz;
  float slider_sz;
  float grab_padding;
  float v_range_f;
  bool is_floating_point;
  bool is_logarithmic;
  ImGuiAxis axis;
  ImGuiStyle *style;
  ImGuiContext *g;
  float in_stack_fffffffffffffee0;
  float in_stack_fffffffffffffee4;
  float in_stack_fffffffffffffee8;
  float in_stack_fffffffffffffeec;
  uint in_stack_fffffffffffffef0;
  uint uVar15;
  float in_stack_fffffffffffffef4;
  float local_fc;
  ulong local_f8;
  ImVec2 local_e8;
  ImVec2 local_e0;
  ImVec2 local_d8;
  ImVec2 local_d0;
  float local_c4;
  ImVec2 local_c0;
  ImVec2 in_stack_ffffffffffffff48;
  undefined8 in_stack_ffffffffffffff50;
  ImGuiDataType data_type_00;
  undefined4 in_stack_ffffffffffffff58;
  float in_stack_ffffffffffffff5c;
  float local_84;
  float local_78;
  bool local_69;
  float local_50;
  ImGuiStyle *pIVar16;
  float zero_deadzone_halfsize_00;
  ImGuiContext *pIVar17;
  undefined1 is_logarithmic_00;
  
  data_type_00 = (ImGuiDataType)((ulong)in_stack_ffffffffffffff50 >> 0x20);
  pIVar16 = &GImGui->Style;
  uVar5 = (uint)((in_stack_00000010 & 0x100000) != 0);
  bVar8 = in_EDX == 1.12104e-44;
  bVar9 = in_EDX == 1.26117e-44;
  if (in_R8 < in_R9) {
    local_f8 = in_R9 - in_R8;
  }
  else {
    local_f8 = in_R8 - in_R9;
  }
  local_fc = (float)local_f8;
  pIVar17 = GImGui;
  fVar10 = ImVec2::operator[](in_RDI + 1,(long)(int)uVar5);
  fVar11 = ImVec2::operator[](in_RDI,(long)(int)uVar5);
  fVar10 = (fVar10 - fVar11) - 4.0;
  local_50 = pIVar16->GrabMinSize;
  if ((!bVar8 && !bVar9) && (0.0 <= local_fc)) {
    local_50 = ImMax<float>(fVar10 / (local_fc + 1.0),pIVar16->GrabMinSize);
  }
  fVar11 = ImMin<float>(local_50,fVar10);
  fVar12 = fVar10 - fVar11;
  fVar13 = ImVec2::operator[](in_RDI,(long)(int)uVar5);
  fVar13 = fVar11 * 0.5 + fVar13 + 2.0;
  fVar14 = ImVec2::operator[](in_RDI + 1,(long)(int)uVar5);
  fVar14 = -fVar11 * 0.5 + (fVar14 - 2.0);
  if ((in_stack_00000010 & 0x20) != 0) {
    if (bVar8 || bVar9) {
      ImParseFormatPrecision
                ((char *)CONCAT44(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8),
                 (int)in_stack_fffffffffffffee4);
    }
    ImPow(0.0,3.70239e-39);
    in_stack_fffffffffffffef4 = pIVar16->LogSliderDeadzone * 0.5;
    ImMax<float>(fVar12,1.0);
  }
  zero_deadzone_halfsize_00 = (float)((ulong)pIVar16 >> 0x20);
  local_69 = false;
  if (pIVar17->ActiveId == in_ESI) {
    bVar2 = false;
    if (pIVar17->ActiveIdSource == ImGuiInputSource_Mouse) {
      if (((pIVar17->IO).MouseDown[0] & 1U) == 0) {
        ClearActiveID();
        is_logarithmic_00 = (undefined1)(in_ESI >> 0x18);
      }
      else {
        pfVar6 = ImVec2::operator[](&(pIVar17->IO).MousePos,(long)(int)uVar5);
        is_logarithmic_00 = (undefined1)(in_ESI >> 0x18);
        fVar1 = *pfVar6;
        uVar15 = in_stack_fffffffffffffef0;
        if ((pIVar17->ActiveIdIsJustActivated & 1U) != 0) {
          local_78 = ScaleRatioFromValueT<unsigned_long_long,long_long,double>
                               ((ImGuiDataType)in_EDX,(unsigned_long_long)in_RCX,in_R8,in_R9,
                                SUB81((ulong)pIVar17 >> 0x38,0),SUB84(pIVar17,0),
                                zero_deadzone_halfsize_00);
          if (uVar5 == 1) {
            local_78 = 1.0 - local_78;
          }
          in_stack_fffffffffffffeec = ImLerp<float>(fVar13,fVar14,local_78);
          uVar15 = in_stack_fffffffffffffef0 & 0xffffff;
          if ((-fVar11 * 0.5 + in_stack_fffffffffffffeec) - 1.0 <= fVar1) {
            uVar15 = CONCAT13(fVar1 <= fVar11 * 0.5 + in_stack_fffffffffffffeec + 1.0,
                              (int3)in_stack_fffffffffffffef0);
          }
          if (((char)(uVar15 >> 0x18) == '\0') || (!bVar8 && !bVar9)) {
            in_stack_fffffffffffffeec = 0.0;
          }
          else {
            in_stack_fffffffffffffeec = fVar1 - in_stack_fffffffffffffeec;
          }
          pIVar17->SliderGrabClickOffset = in_stack_fffffffffffffeec;
        }
        if (0.0 < fVar12) {
          ImSaturate(((fVar1 - pIVar17->SliderGrabClickOffset) - fVar13) / fVar12);
        }
        bVar2 = true;
        in_stack_fffffffffffffef0 = uVar15;
      }
    }
    else {
      if ((pIVar17->ActiveIdSource == ImGuiInputSource_Keyboard) ||
         (pIVar17->ActiveIdSource == ImGuiInputSource_Gamepad)) {
        if ((pIVar17->ActiveIdIsJustActivated & 1U) != 0) {
          pIVar17->SliderCurrentAccum = 0.0;
          pIVar17->SliderCurrentAccumDirty = false;
        }
        if (uVar5 == 0) {
          in_stack_fffffffffffffee8 = GetNavTweakPressedAmount((ImGuiAxis)in_stack_fffffffffffffef4)
          ;
        }
        else {
          in_stack_fffffffffffffee8 = GetNavTweakPressedAmount((ImGuiAxis)in_stack_fffffffffffffef4)
          ;
          in_stack_fffffffffffffee8 = -in_stack_fffffffffffffee8;
        }
        if ((in_stack_fffffffffffffee8 != 0.0) || (NAN(in_stack_fffffffffffffee8))) {
          fVar11 = in_stack_fffffffffffffee8;
          bVar3 = IsKeyDown(ImGuiKey_KeysData_OFFSET);
          bVar4 = IsKeyDown(ImGuiKey_KeysData_OFFSET);
          if (bVar8 || bVar9) {
            in_stack_fffffffffffffee4 =
                 (float)ImParseFormatPrecision
                                  ((char *)CONCAT44(in_stack_fffffffffffffeec,fVar11),
                                   (int)in_stack_fffffffffffffee4);
          }
          else {
            in_stack_fffffffffffffee4 = 0.0;
          }
          if ((int)in_stack_fffffffffffffee4 < 1) {
            if ((((-100.0 <= local_fc) && (local_fc <= 100.0)) &&
                ((local_fc != 0.0 || (NAN(local_fc))))) || (bVar3)) {
              local_84 = (float)(~-(uint)(in_stack_fffffffffffffee8 < 0.0) & 0x3f800000 |
                                -(uint)(in_stack_fffffffffffffee8 < 0.0) & 0xbf800000) / local_fc;
            }
            else {
              local_84 = in_stack_fffffffffffffee8 / 100.0;
            }
          }
          else {
            local_84 = in_stack_fffffffffffffee8 / 100.0;
            if (bVar3) {
              local_84 = local_84 / 10.0;
            }
          }
          if (bVar4) {
            local_84 = local_84 * 10.0;
          }
          pIVar17->SliderCurrentAccum = local_84 + pIVar17->SliderCurrentAccum;
          pIVar17->SliderCurrentAccumDirty = true;
          in_stack_fffffffffffffee8 = fVar11;
        }
        fVar11 = pIVar17->SliderCurrentAccum;
        if ((pIVar17->NavActivatePressedId == in_ESI) &&
           ((pIVar17->ActiveIdIsJustActivated & 1U) == 0)) {
          ClearActiveID();
        }
        else if ((pIVar17->SliderCurrentAccumDirty & 1U) != 0) {
          fVar12 = ScaleRatioFromValueT<unsigned_long_long,long_long,double>
                             ((ImGuiDataType)in_EDX,(unsigned_long_long)in_RCX,in_R8,in_R9,
                              SUB81((ulong)pIVar17 >> 0x38,0),SUB84(pIVar17,0),
                              zero_deadzone_halfsize_00);
          if (((1.0 <= fVar12) && (0.0 < fVar11)) || ((fVar12 <= 0.0 && (fVar11 < 0.0)))) {
            bVar2 = false;
            pIVar17->SliderCurrentAccum = 0.0;
          }
          else {
            bVar2 = true;
            ImSaturate(fVar12 + fVar11);
            ScaleValueFromRatioT<unsigned_long_long,long_long,double>
                      (in_stack_0000000c,in_stack_00000008,unaff_retaddr,(unsigned_long_long)in_RDI,
                       SUB41(in_ESI >> 0x18,0),in_EDX,(float)((ulong)in_RCX >> 0x20));
            if ((bVar8 || bVar9) && ((in_stack_00000010 & 0x40) == 0)) {
              RoundScalarWithFormatT<unsigned_long_long>
                        ((char *)CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58),
                         data_type_00,(unsigned_long_long)in_stack_ffffffffffffff48);
            }
            in_stack_ffffffffffffff5c =
                 ScaleRatioFromValueT<unsigned_long_long,long_long,double>
                           ((ImGuiDataType)in_EDX,(unsigned_long_long)in_RCX,in_R8,in_R9,
                            SUB81((ulong)pIVar17 >> 0x38,0),SUB84(pIVar17,0),
                            zero_deadzone_halfsize_00);
            if (fVar11 <= 0.0) {
              fVar11 = ImMax<float>(in_stack_ffffffffffffff5c - fVar12,fVar11);
              pIVar17->SliderCurrentAccum = pIVar17->SliderCurrentAccum - fVar11;
            }
            else {
              fVar11 = ImMin<float>(in_stack_ffffffffffffff5c - fVar12,fVar11);
              pIVar17->SliderCurrentAccum = pIVar17->SliderCurrentAccum - fVar11;
            }
          }
          pIVar17->SliderCurrentAccumDirty = false;
        }
      }
      is_logarithmic_00 = (undefined1)(in_ESI >> 0x18);
    }
    if ((bVar2) &&
       ((((pIVar17->LastItemData).InFlags & 0x800U) != 0 || ((in_stack_00000010 & 0x200000) != 0))))
    {
      bVar2 = false;
    }
    if (bVar2) {
      uVar7 = ScaleValueFromRatioT<unsigned_long_long,long_long,double>
                        (in_stack_0000000c,in_stack_00000008,unaff_retaddr,
                         (unsigned_long_long)in_RDI,(bool)is_logarithmic_00,in_EDX,
                         (float)((ulong)in_RCX >> 0x20));
      if ((bVar8 || bVar9) && ((in_stack_00000010 & 0x40) == 0)) {
        uVar7 = RoundScalarWithFormatT<unsigned_long_long>
                          ((char *)CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58),
                           (ImGuiDataType)(uVar7 >> 0x20),
                           (unsigned_long_long)in_stack_ffffffffffffff48);
      }
      local_69 = *in_RCX != uVar7;
      if (local_69) {
        *in_RCX = uVar7;
      }
    }
  }
  if (1.0 <= fVar10) {
    local_c4 = ScaleRatioFromValueT<unsigned_long_long,long_long,double>
                         ((ImGuiDataType)in_EDX,(unsigned_long_long)in_RCX,in_R8,in_R9,
                          SUB81((ulong)pIVar17 >> 0x38,0),SUB84(pIVar17,0),zero_deadzone_halfsize_00
                         );
    if (uVar5 == 1) {
      local_c4 = 1.0 - local_c4;
    }
    ImLerp<float>(fVar13,fVar14,local_c4);
    if (uVar5 == 0) {
      ImRect::ImRect((ImRect *)CONCAT44(in_stack_fffffffffffffef4,in_stack_fffffffffffffef0),
                     in_stack_fffffffffffffeec,in_stack_fffffffffffffee8,in_stack_fffffffffffffee4,
                     in_stack_fffffffffffffee0);
      *in_stack_00000018 = local_d8;
      in_stack_00000018[1] = local_d0;
    }
    else {
      ImRect::ImRect((ImRect *)CONCAT44(in_stack_fffffffffffffef4,in_stack_fffffffffffffef0),
                     in_stack_fffffffffffffeec,in_stack_fffffffffffffee8,in_stack_fffffffffffffee4,
                     in_stack_fffffffffffffee0);
      *in_stack_00000018 = local_e8;
      in_stack_00000018[1] = local_e0;
    }
  }
  else {
    ImRect::ImRect((ImRect *)&local_c0,in_RDI,in_RDI);
    *in_stack_00000018 = local_c0;
    in_stack_00000018[1] = in_stack_ffffffffffffff48;
  }
  return local_69;
}

Assistant:

bool ImGui::SliderBehaviorT(const ImRect& bb, ImGuiID id, ImGuiDataType data_type, TYPE* v, const TYPE v_min, const TYPE v_max, const char* format, ImGuiSliderFlags flags, ImRect* out_grab_bb)
{
    ImGuiContext& g = *GImGui;
    const ImGuiStyle& style = g.Style;

    const ImGuiAxis axis = (flags & ImGuiSliderFlags_Vertical) ? ImGuiAxis_Y : ImGuiAxis_X;
    const bool is_logarithmic = (flags & ImGuiSliderFlags_Logarithmic) != 0;
    const bool is_floating_point = (data_type == ImGuiDataType_Float) || (data_type == ImGuiDataType_Double);
    const float v_range_f = (float)(v_min < v_max ? v_max - v_min : v_min - v_max); // We don't need high precision for what we do with it.

    // Calculate bounds
    const float grab_padding = 2.0f; // FIXME: Should be part of style.
    const float slider_sz = (bb.Max[axis] - bb.Min[axis]) - grab_padding * 2.0f;
    float grab_sz = style.GrabMinSize;
    if (!is_floating_point && v_range_f >= 0.0f)                         // v_range_f < 0 may happen on integer overflows
        grab_sz = ImMax(slider_sz / (v_range_f + 1), style.GrabMinSize); // For integer sliders: if possible have the grab size represent 1 unit
    grab_sz = ImMin(grab_sz, slider_sz);
    const float slider_usable_sz = slider_sz - grab_sz;
    const float slider_usable_pos_min = bb.Min[axis] + grab_padding + grab_sz * 0.5f;
    const float slider_usable_pos_max = bb.Max[axis] - grab_padding - grab_sz * 0.5f;

    float logarithmic_zero_epsilon = 0.0f; // Only valid when is_logarithmic is true
    float zero_deadzone_halfsize = 0.0f; // Only valid when is_logarithmic is true
    if (is_logarithmic)
    {
        // When using logarithmic sliders, we need to clamp to avoid hitting zero, but our choice of clamp value greatly affects slider precision. We attempt to use the specified precision to estimate a good lower bound.
        const int decimal_precision = is_floating_point ? ImParseFormatPrecision(format, 3) : 1;
        logarithmic_zero_epsilon = ImPow(0.1f, (float)decimal_precision);
        zero_deadzone_halfsize = (style.LogSliderDeadzone * 0.5f) / ImMax(slider_usable_sz, 1.0f);
    }

    // Process interacting with the slider
    bool value_changed = false;
    if (g.ActiveId == id)
    {
        bool set_new_value = false;
        float clicked_t = 0.0f;
        if (g.ActiveIdSource == ImGuiInputSource_Mouse)
        {
            if (!g.IO.MouseDown[0])
            {
                ClearActiveID();
            }
            else
            {
                const float mouse_abs_pos = g.IO.MousePos[axis];
                if (g.ActiveIdIsJustActivated)
                {
                    float grab_t = ScaleRatioFromValueT<TYPE, SIGNEDTYPE, FLOATTYPE>(data_type, *v, v_min, v_max, is_logarithmic, logarithmic_zero_epsilon, zero_deadzone_halfsize);
                    if (axis == ImGuiAxis_Y)
                        grab_t = 1.0f - grab_t;
                    const float grab_pos = ImLerp(slider_usable_pos_min, slider_usable_pos_max, grab_t);
                    const bool clicked_around_grab = (mouse_abs_pos >= grab_pos - grab_sz * 0.5f - 1.0f) && (mouse_abs_pos <= grab_pos + grab_sz * 0.5f + 1.0f); // No harm being extra generous here.
                    g.SliderGrabClickOffset = (clicked_around_grab && is_floating_point) ? mouse_abs_pos - grab_pos : 0.0f;
                }
                if (slider_usable_sz > 0.0f)
                    clicked_t = ImSaturate((mouse_abs_pos - g.SliderGrabClickOffset - slider_usable_pos_min) / slider_usable_sz);
                if (axis == ImGuiAxis_Y)
                    clicked_t = 1.0f - clicked_t;
                set_new_value = true;
            }
        }
        else if (g.ActiveIdSource == ImGuiInputSource_Keyboard || g.ActiveIdSource == ImGuiInputSource_Gamepad)
        {
            if (g.ActiveIdIsJustActivated)
            {
                g.SliderCurrentAccum = 0.0f; // Reset any stored nav delta upon activation
                g.SliderCurrentAccumDirty = false;
            }

            float input_delta = (axis == ImGuiAxis_X) ? GetNavTweakPressedAmount(axis) : -GetNavTweakPressedAmount(axis);
            if (input_delta != 0.0f)
            {
                const bool tweak_slow = IsKeyDown((g.NavInputSource == ImGuiInputSource_Gamepad) ? ImGuiKey_NavGamepadTweakSlow : ImGuiKey_NavKeyboardTweakSlow);
                const bool tweak_fast = IsKeyDown((g.NavInputSource == ImGuiInputSource_Gamepad) ? ImGuiKey_NavGamepadTweakFast : ImGuiKey_NavKeyboardTweakFast);
                const int decimal_precision = is_floating_point ? ImParseFormatPrecision(format, 3) : 0;
                if (decimal_precision > 0)
                {
                    input_delta /= 100.0f;    // Gamepad/keyboard tweak speeds in % of slider bounds
                    if (tweak_slow)
                        input_delta /= 10.0f;
                }
                else
                {
                    if ((v_range_f >= -100.0f && v_range_f <= 100.0f && v_range_f != 0.0f) || tweak_slow)
                        input_delta = ((input_delta < 0.0f) ? -1.0f : +1.0f) / v_range_f; // Gamepad/keyboard tweak speeds in integer steps
                    else
                        input_delta /= 100.0f;
                }
                if (tweak_fast)
                    input_delta *= 10.0f;

                g.SliderCurrentAccum += input_delta;
                g.SliderCurrentAccumDirty = true;
            }

            float delta = g.SliderCurrentAccum;
            if (g.NavActivatePressedId == id && !g.ActiveIdIsJustActivated)
            {
                ClearActiveID();
            }
            else if (g.SliderCurrentAccumDirty)
            {
                clicked_t = ScaleRatioFromValueT<TYPE, SIGNEDTYPE, FLOATTYPE>(data_type, *v, v_min, v_max, is_logarithmic, logarithmic_zero_epsilon, zero_deadzone_halfsize);

                if ((clicked_t >= 1.0f && delta > 0.0f) || (clicked_t <= 0.0f && delta < 0.0f)) // This is to avoid applying the saturation when already past the limits
                {
                    set_new_value = false;
                    g.SliderCurrentAccum = 0.0f; // If pushing up against the limits, don't continue to accumulate
                }
                else
                {
                    set_new_value = true;
                    float old_clicked_t = clicked_t;
                    clicked_t = ImSaturate(clicked_t + delta);

                    // Calculate what our "new" clicked_t will be, and thus how far we actually moved the slider, and subtract this from the accumulator
                    TYPE v_new = ScaleValueFromRatioT<TYPE, SIGNEDTYPE, FLOATTYPE>(data_type, clicked_t, v_min, v_max, is_logarithmic, logarithmic_zero_epsilon, zero_deadzone_halfsize);
                    if (is_floating_point && !(flags & ImGuiSliderFlags_NoRoundToFormat))
                        v_new = RoundScalarWithFormatT<TYPE>(format, data_type, v_new);
                    float new_clicked_t = ScaleRatioFromValueT<TYPE, SIGNEDTYPE, FLOATTYPE>(data_type, v_new, v_min, v_max, is_logarithmic, logarithmic_zero_epsilon, zero_deadzone_halfsize);

                    if (delta > 0)
                        g.SliderCurrentAccum -= ImMin(new_clicked_t - old_clicked_t, delta);
                    else
                        g.SliderCurrentAccum -= ImMax(new_clicked_t - old_clicked_t, delta);
                }

                g.SliderCurrentAccumDirty = false;
            }
        }

        if (set_new_value)
            if ((g.LastItemData.InFlags & ImGuiItemFlags_ReadOnly) || (flags & ImGuiSliderFlags_ReadOnly))
                set_new_value = false;

        if (set_new_value)
        {
            TYPE v_new = ScaleValueFromRatioT<TYPE, SIGNEDTYPE, FLOATTYPE>(data_type, clicked_t, v_min, v_max, is_logarithmic, logarithmic_zero_epsilon, zero_deadzone_halfsize);

            // Round to user desired precision based on format string
            if (is_floating_point && !(flags & ImGuiSliderFlags_NoRoundToFormat))
                v_new = RoundScalarWithFormatT<TYPE>(format, data_type, v_new);

            // Apply result
            if (*v != v_new)
            {
                *v = v_new;
                value_changed = true;
            }
        }
    }

    if (slider_sz < 1.0f)
    {
        *out_grab_bb = ImRect(bb.Min, bb.Min);
    }
    else
    {
        // Output grab position so it can be displayed by the caller
        float grab_t = ScaleRatioFromValueT<TYPE, SIGNEDTYPE, FLOATTYPE>(data_type, *v, v_min, v_max, is_logarithmic, logarithmic_zero_epsilon, zero_deadzone_halfsize);
        if (axis == ImGuiAxis_Y)
            grab_t = 1.0f - grab_t;
        const float grab_pos = ImLerp(slider_usable_pos_min, slider_usable_pos_max, grab_t);
        if (axis == ImGuiAxis_X)
            *out_grab_bb = ImRect(grab_pos - grab_sz * 0.5f, bb.Min.y + grab_padding, grab_pos + grab_sz * 0.5f, bb.Max.y - grab_padding);
        else
            *out_grab_bb = ImRect(bb.Min.x + grab_padding, grab_pos - grab_sz * 0.5f, bb.Max.x - grab_padding, grab_pos + grab_sz * 0.5f);
    }

    return value_changed;
}